

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.h
# Opt level: O3

void idx2::CopyGridExtent<double,double>(grid *SGrid,volume *SVol,extent *DGrid,volume *DVol)

{
  u64 uVar1;
  u64 uVar2;
  u64 uVar3;
  u64 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  byte *pbVar9;
  long lVar10;
  int iVar11;
  byte *pbVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  byte *pbVar23;
  long lVar24;
  long lVar25;
  byte *local_78;
  byte *local_68;
  
  uVar1 = (SGrid->super_extent).Dims;
  uVar2 = SGrid->Strd;
  lVar16 = (long)(uVar2 * 2) >> 0x2b;
  iVar15 = (int)((long)(uVar1 * 2) >> 0x2b) * (int)((long)(uVar2 * 2) >> 0x2b);
  if (0 < iVar15) {
    uVar3 = (SGrid->super_extent).From;
    lVar25 = (long)(uVar3 << 0x2b) >> 0x2b;
    uVar4 = DGrid->From;
    lVar10 = (long)(SVol->Dims << 0x2b) >> 0x2b;
    lVar22 = (long)(uVar3 * 2) >> 0x2b;
    lVar17 = (long)(SVol->Dims << 0x16) >> 0x2b;
    lVar13 = (long)(uVar3 << 0x16) >> 0x2b;
    local_68 = (SVol->Buffer).Data + (lVar13 * 8 + lVar17 * lVar22 * 8) * lVar10 + lVar25 * 8;
    lVar20 = (long)(DVol->Dims << 0x16) >> 0x2b;
    lVar19 = (long)(uVar2 << 0x2b) >> 0x2b;
    lVar24 = (long)(DVol->Dims << 0x2b) >> 0x2b;
    iVar6 = (int)((long)(uVar3 << 0x16) >> 0x2b);
    iVar11 = (int)((long)(uVar1 << 0x16) >> 0x2b) * (int)((long)(uVar2 << 0x16) >> 0x2b) + iVar6;
    iVar5 = (int)((long)(uVar3 << 0x2b) >> 0x2b);
    iVar7 = (int)((long)(uVar1 << 0x2b) >> 0x2b) * (int)((long)(uVar2 << 0x2b) >> 0x2b) + iVar5;
    local_78 = (DVol->Buffer).Data +
               (((long)(uVar4 << 0x16) >> 0x2b) * 8 + ((long)(uVar4 * 2) >> 0x2b) * lVar20 * 8) *
               lVar24 + ((long)(uVar4 << 0x2b) >> 0x2b) * 8;
    lVar14 = (long)(uVar2 << 0x16) >> 0x2b;
    do {
      pbVar9 = local_78;
      lVar21 = lVar13;
      pbVar23 = local_68;
      if (iVar6 < iVar11) {
        do {
          pbVar8 = pbVar23;
          pbVar12 = pbVar9;
          lVar18 = lVar25;
          if (iVar5 < iVar7) {
            do {
              *(undefined8 *)pbVar12 = *(undefined8 *)pbVar8;
              lVar18 = lVar18 + lVar19;
              pbVar8 = pbVar8 + lVar19 * 8;
              pbVar12 = pbVar12 + 8;
            } while (lVar18 < iVar7);
          }
          lVar21 = lVar21 + lVar14;
          pbVar9 = pbVar9 + lVar24 * 8;
          pbVar23 = pbVar23 + lVar10 * lVar14 * 8;
        } while (lVar21 < iVar11);
      }
      lVar22 = lVar22 + lVar16;
      local_68 = local_68 + lVar17 * lVar16 * lVar10 * 8;
      local_78 = local_78 + lVar20 * lVar24 * 8;
    } while (lVar22 < iVar15 + (int)((long)(uVar3 * 2) >> 0x2b));
  }
  return;
}

Assistant:

idx2_Inline v3i
Dims(const grid& Grid)
{
  return Unpack3i64(Grid.Dims);
}